

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.cc
# Opt level: O0

void __thiscall
InvertDatabase::suffix_add_item_eqgraph(InvertDatabase *this,char use_seq,int it1,int it2)

{
  bool bVar1;
  int num_class_;
  reference __a;
  __shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2> *this_00;
  EqGrNode *this_01;
  element_type *this_02;
  __shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var2;
  element_type *peVar3;
  int it2_local;
  int it1_local;
  char use_seq_local;
  InvertDatabase *this_local;
  
  __a = std::vector<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>::
        operator[](&this->eqgraph,(long)it2);
  bVar1 = std::operator==(__a,(nullptr_t)0x0);
  if (bVar1) {
    this_00 = &std::vector<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>::
               operator[](&this->eqgraph,(long)it2)->
               super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>;
    this_01 = (EqGrNode *)operator_new(0x60);
    this_02 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                         )&this->cls);
    num_class_ = ClassInfo::get_num_class(this_02);
    EqGrNode::EqGrNode(this_01,2,num_class_);
    std::__shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>::reset<EqGrNode>(this_00,this_01);
  }
  if (use_seq == '\0') {
    p_Var2 = (__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::vector<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>::
             operator[](&this->eqgraph,(long)it2);
    peVar3 = std::__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var2);
    EqGrNode::add_element(peVar3,it1);
  }
  else {
    p_Var2 = (__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::vector<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>::
             operator[](&this->eqgraph,(long)it2);
    peVar3 = std::__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var2);
    EqGrNode::seqadd_element(peVar3,it1);
  }
  return;
}

Assistant:

void InvertDatabase::suffix_add_item_eqgraph(char use_seq, int it1, int it2) {
    if (eqgraph[it2] == nullptr) {
        eqgraph[it2].reset(new EqGrNode(2, cls->get_num_class()));
    }
    if (use_seq) eqgraph[it2]->seqadd_element(it1);
    else eqgraph[it2]->add_element(it1);
}